

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,
          vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *other,
          polymorphic_allocator<unsigned_char> *alloc)

{
  size_t i;
  ulong uVar1;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (uchar *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,other->nStored);
  for (uVar1 = 0; uVar1 < other->nStored; uVar1 = uVar1 + 1) {
    this->ptr[uVar1] = other->ptr[uVar1];
  }
  this->nStored = other->nStored;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }